

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Scene::render_in_opengl(Scene *this)

{
  SceneObject *pSVar1;
  bool bVar2;
  reference ppSVar3;
  SceneObject *obj_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2_1;
  SceneObject *obj;
  iterator __end2;
  iterator __begin2;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2;
  Scene *this_local;
  
  __end2 = std::
           set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
           ::begin(&this->objects);
  obj = (SceneObject *)
        std::
        set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
        ::end(&this->objects);
  while( true ) {
    bVar2 = std::operator!=(&__end2,(_Self *)&obj);
    if (!bVar2) break;
    ppSVar3 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*(&__end2);
    pSVar1 = *ppSVar3;
    if (((pSVar1->isVisible & 1U) != 0) && ((pSVar1->isGhosted & 1U) == 0)) {
      (*pSVar1->_vptr_SceneObject[1])();
    }
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(&__end2);
  }
  __end2_1 = std::
             set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
             ::begin(&this->objects);
  obj_1 = (SceneObject *)
          std::
          set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
          ::end(&this->objects);
  while( true ) {
    bVar2 = std::operator!=(&__end2_1,(_Self *)&obj_1);
    if (!bVar2) break;
    ppSVar3 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                        (&__end2_1);
    pSVar1 = *ppSVar3;
    if (((pSVar1->isVisible & 1U) != 0) && ((pSVar1->isGhosted & 1U) != 0)) {
      (*pSVar1->_vptr_SceneObject[3])();
    }
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(&__end2_1);
  }
  return;
}

Assistant:

void Scene::render_in_opengl()
{
   for (SceneObject *obj : objects)
   {
      if( obj->isVisible && !obj->isGhosted )
      {
         obj->draw();
      }
   }

   for (SceneObject *obj : objects)
   {
      if( obj->isVisible && obj->isGhosted )
      {
         obj->drawGhost();
      }
   }
}